

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O2

double __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
::maxErrorRelAbove1(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
                    *this,double x0,double y0,double x1,double y1)

{
  array<double,_2UL> *pt;
  pointer paVar1;
  Error *pEVar2;
  double *in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar4;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double dVar5;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double dVar6;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> points;
  array<double,_2UL> local_48;
  double local_38;
  double local_30;
  double x1_local;
  double x0_local;
  
  x1_local = x1;
  x0_local = x0;
  if (x1 <= x0) {
    pEVar2 = (Error *)__cxa_allocate_exception(0x18);
    fmt::format<double,double>
              ((string *)&points,(fmt *)"PLApprox maxErrRel(): degenerate segment, x0>=x1: {}, {}",
               (CStringRef)&x0_local,&x1_local,in_R8);
    Error::Error(pEVar2,(CStringRef)
                        points.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,-1);
    __cxa_throw(pEVar2,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  if (this->laPrm_->ubErr <= 0.0) {
    pEVar2 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(pEVar2,(CStringRef)0x2c2b38,-1);
    __cxa_throw(pEVar2,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  points.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  points.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  points.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_BasicPLApproximator[9])(this);
  (*this->_vptr_BasicPLApproximator[9])(x1,this);
  local_48._M_elems[1] = y0;
  std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
  emplace_back<std::array<double,2ul>>
            ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&points,
             &local_48);
  local_48._M_elems[1] = y1;
  std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
  emplace_back<std::array<double,2ul>>
            ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&points,
             &local_48);
  dVar3 = (y1 - y0) / (x1 - x0);
  (*this->_vptr_BasicPLApproximator[0x20])(this);
  (*this->_vptr_BasicPLApproximator[9])(this);
  local_48._M_elems[1] = (extraout_XMM0_Qa_01 - x0) * dVar3 + y0;
  local_48._M_elems[0] = extraout_XMM0_Qa_02;
  std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
  emplace_back<std::array<double,2ul>>
            ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&points,
             &local_48);
  (*this->_vptr_BasicPLApproximator[0xb])(x0,this);
  (*this->_vptr_BasicPLApproximator[0xb])(x1,this);
  local_30 = extraout_XMM0_Qa_04;
  dVar6 = extraout_XMM0_Qa_03;
  if (extraout_XMM0_Qa_03 <= extraout_XMM0_Qa_04) {
    local_30 = extraout_XMM0_Qa_03;
    dVar6 = extraout_XMM0_Qa_04;
  }
  dVar5 = this->laPrm_->ubErr;
  dVar4 = dVar3 / (dVar5 + 1.0);
  if ((local_30 <= dVar4) && (dVar4 <= dVar6)) {
    (*this->_vptr_BasicPLApproximator[0x20])(this);
    local_38 = extraout_XMM0_Qa_05;
    (*this->_vptr_BasicPLApproximator[9])(this);
    local_48._M_elems[1] = (local_38 - x0) * dVar3 + y0;
    local_48._M_elems[0] = extraout_XMM0_Qa_06;
    std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
    emplace_back<std::array<double,2ul>>
              ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&points,
               &local_48);
    dVar5 = this->laPrm_->ubErr;
  }
  if ((((dVar5 != 1.0) || (NAN(dVar5))) && (dVar5 = dVar3 / (1.0 - dVar5), local_30 <= dVar5)) &&
     (dVar5 <= dVar6)) {
    (*this->_vptr_BasicPLApproximator[0x20])(this);
    (*this->_vptr_BasicPLApproximator[9])(this);
    local_48._M_elems[1] = (extraout_XMM0_Qa_07 - x0) * dVar3 + y0;
    local_48._M_elems[0] = extraout_XMM0_Qa_08;
    std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
    emplace_back<std::array<double,2ul>>
              ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&points,
               &local_48);
  }
  if ((extraout_XMM0_Qa < 1.0) && (1.0 < extraout_XMM0_Qa_00)) {
    (*this->_vptr_BasicPLApproximator[0x1f])(0x3ff0000000000000,this);
    if ((extraout_XMM0_Qa_09 <= x0) || (x1 <= extraout_XMM0_Qa_09)) {
      pEVar2 = (Error *)__cxa_allocate_exception(0x18);
      Error::Error(pEVar2,(CStringRef)0x2c2b57,-1);
      __cxa_throw(pEVar2,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    local_48._M_elems[0] = 1.0;
    local_48._M_elems[1] = (extraout_XMM0_Qa_09 - x0) * dVar3 + y0;
    std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
    emplace_back<std::array<double,2ul>>
              ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&points,
               &local_48);
  }
  if ((extraout_XMM0_Qa < -1.0) && (-1.0 < extraout_XMM0_Qa_00)) {
    (*this->_vptr_BasicPLApproximator[0x1f])(0xbff0000000000000,this);
    if ((extraout_XMM0_Qa_10 <= x0) || (x1 <= extraout_XMM0_Qa_10)) {
      pEVar2 = (Error *)__cxa_allocate_exception(0x18);
      Error::Error(pEVar2,(CStringRef)0x2c2b80,-1);
      __cxa_throw(pEVar2,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    local_48._M_elems[0] = -1.0;
    local_48._M_elems[1] = (extraout_XMM0_Qa_10 - x0) * dVar3 + y0;
    std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
    emplace_back<std::array<double,2ul>>
              ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&points,
               &local_48);
  }
  dVar6 = 0.0;
  for (paVar1 = points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar1 != points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; paVar1 = paVar1 + 1) {
    dVar3 = paVar1->_M_elems[0];
    dVar5 = dVar3 - paVar1->_M_elems[1];
    dVar3 = ABS((double)(~-(ulong)(1.0 < ABS(dVar3)) & (ulong)dVar5 |
                        (ulong)(dVar5 / dVar3) & -(ulong)(1.0 < ABS(dVar3))));
    if (dVar3 <= dVar6) {
      dVar3 = dVar6;
    }
    dVar6 = dVar3;
  }
  std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
  ~_Vector_base(&points.
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               );
  return dVar6;
}

Assistant:

double BasicPLApproximator<FuncCon>::maxErrorRelAbove1(
    double x0, double y0, double x1, double y1) {
  MP_ASSERT_ALWAYS(x1>x0,
                   fmt::format(
                     "PLApprox maxErrRel(): degenerate segment,"
                     " x0>=x1: {}, {}", x0, x1));
  MP_ASSERT_ALWAYS(laPrm_.ubErr>0.0,
                   "PLApprox maxErrRel(): ubErr<=0");
  std::vector< std::array<double, 2> > points;
  auto f0 = eval(x0);
  auto f1 = eval(x1);
  points.push_back({f0, y0});
  points.push_back({f1, y1});
  auto slope = (y1-y0)/(x1-x0);        // segment slope
  auto xMid = inverse_1st_with_check( slope );    // middle-value point
  points.push_back( { eval(xMid), y0 + (xMid-x0) * slope } );
  /// Assuming f' is monotone on the subinterval,
  /// check points of tilted slope assuming they are present.
  /// An alternative to evaluating f' on the endpoints
  /// would be to have a domain/subintervals for f'.
  auto fp0 = eval_1st(x0);
  auto fp1 = eval_1st(x1);
  if (fp0>fp1)
    std::swap(fp0, fp1);
  {
    auto slopeTiltedAway = slope / (1+laPrm_.ubErr);
    if (slopeTiltedAway>=fp0 && slopeTiltedAway<=fp1) {
      auto xMidUp = inverse_1st_with_check( slopeTiltedAway );
      points.push_back( { eval(xMidUp), y0 + (xMidUp-x0) * slope } );
    }
  }
  if (1.0!=laPrm_.ubErr) {
    auto slopeTiltedTo = slope / (1-laPrm_.ubErr);
    if (slopeTiltedTo>=fp0 && slopeTiltedTo<=fp1) {
      auto xMidDn = inverse_1st_with_check( slopeTiltedTo );
      points.push_back( { eval(xMidDn), y0 + (xMidDn-x0) * slope } );
    }
  }
  if (f0<1.0 && f1>1.0) {
    auto x_preim_1 = inverse_with_check(1.0);
    MP_ASSERT_ALWAYS(x0<x_preim_1 && x1>x_preim_1,
                     "PLApprox maxErrRel(): preim(1.0) outside");
    points.push_back( { 1.0, y0 + (x_preim_1-x0) * slope } );
  }
  if (f0<-1.0 && f1>-1.0) {
    auto x_preim_1 = inverse_with_check(-1.0);
    MP_ASSERT_ALWAYS(x0<x_preim_1 && x1>x_preim_1,
                     "PLApprox maxErrRel(): preim(-1.0) outside");
    points.push_back( { -1.0, y0 + (x_preim_1-x0) * slope } );
  }
  /// Check rel / abs errors in these points
  double errMax=0.0;
  for (const auto& pt: points) {
    auto f=pt[0];
    auto y=pt[1];
    auto err = (f>=-1.0 && f<=1.0) ?
          std::fabs(f-y) :                    // abs error in -1..1
          std::fabs(f-y) / std::fabs(f);      // rel error otherwise
    errMax = std::max(errMax, err);
  }
  return errMax;
}